

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitNew(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  ByteCodeWriter *pBVar1;
  ushort uVar2;
  ParseNode *pnode_00;
  code *pcVar3;
  bool bVar4;
  ArgSlot AVar5;
  uint uVar6;
  RegSlot RVar7;
  ParseNodeCall *pPVar8;
  undefined4 *puVar9;
  undefined7 extraout_var;
  long lVar10;
  uint byteCount;
  uint uVar11;
  ByteCodeGenerator *pBVar12;
  ProfileId callSiteId;
  ByteCodeGenerator *pBVar13;
  BOOL local_64;
  AuxArray<unsigned_int> *pAStack_60;
  BOOL fSideEffectArgs;
  AuxArray<unsigned_int> *spreadIndices;
  ulong local_50;
  uint local_44;
  FuncInfo *local_40;
  ByteCodeGenerator *local_38;
  
  pPVar8 = ParseNode::AsParseNodeCall(pnode);
  local_38 = (ByteCodeGenerator *)(ulong)*(uint *)&pPVar8->argCount;
  uVar11 = *(uint *)&pPVar8->argCount + 1;
  local_64 = 0;
  pPVar8 = ParseNode::AsParseNodeCall(pnode);
  uVar6 = CountArguments(pPVar8->pnodeArgs,&local_64);
  local_50 = (ulong)(uVar11 & 0xffff);
  local_44 = uVar11;
  if (uVar6 != (uVar11 & 0xffff)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x20d1,"(argCount == tmpCount)",
                       "argCount cannot overflow as max args capped at parser level");
    if (!bVar4) goto LAB_00810f19;
    *puVar9 = 0;
  }
  ByteCodeGenerator::StartStatement(byteCodeGenerator,pnode);
  FuncInfo::StartRecordingOutArgs(funcInfo,(uint)local_50);
  if (local_64 != 0) {
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    SaveOpndValue(pPVar8->pnodeTarget,funcInfo);
  }
  pPVar8 = ParseNode::AsParseNodeCall(pnode);
  Emit(pPVar8->pnodeTarget,byteCodeGenerator,funcInfo,0,true,false);
  pPVar8 = ParseNode::AsParseNodeCall(pnode);
  if (pPVar8->pnodeArgs == (ParseNodePtr)0x0) {
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    FuncInfo::ReleaseLoc(funcInfo,pPVar8->pnodeTarget);
    local_40 = funcInfo;
    bVar4 = CreateNativeArrays(byteCodeGenerator,funcInfo);
    uVar6 = 0xc4;
    if (bVar4) {
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      bVar4 = CallTargetIsArray(pPVar8->pnodeTarget);
      uVar6 = (uint)bVar4 * 3 + 0xc4;
    }
    if ((ProfileId)local_38 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x20e7,"(argCount == 1)","argCount == 1");
      if (!bVar4) goto LAB_00810f19;
      *puVar9 = 0;
    }
    pBVar1 = &byteCodeGenerator->m_writer;
    local_44 = uVar6;
    bVar4 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(pBVar1,(OpCode)uVar6);
    uVar2 = byteCodeGenerator->m_callSiteId;
    local_38 = (ByteCodeGenerator *)(ulong)uVar2;
    if (bVar4) {
      if (uVar2 == 0xffff) {
        local_38 = (ByteCodeGenerator *)CONCAT62((int6)((uint7)extraout_var >> 8),0xffff);
      }
      else {
        byteCodeGenerator->m_callSiteId = uVar2 + 1;
      }
    }
    AVar5 = (ArgSlot)local_50;
    Js::ByteCodeWriter::StartCall(pBVar1,StartCall,AVar5);
    funcInfo = local_40;
    RVar7 = FuncInfo::AcquireLoc(local_40,pnode);
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    Js::ByteCodeWriter::CallI
              (pBVar1,(OpCode)local_44,RVar7,pPVar8->pnodeTarget->location,AVar5,(ProfileId)local_38
               ,CallFlags_None);
    goto LAB_00810efe;
  }
  bVar4 = IsCallOfConstants(pnode);
  if (bVar4) {
    uVar6 = (uint)local_50;
    Js::ByteCodeWriter::StartCall(&byteCodeGenerator->m_writer,StartCall,(ArgSlot)local_50);
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    FuncInfo::ReleaseLoc(funcInfo,pPVar8->pnodeTarget);
    AVar5 = EmitNewObjectOfConstants(pnode,byteCodeGenerator,funcInfo,uVar6);
  }
  else {
    bVar4 = CreateNativeArrays(byteCodeGenerator,funcInfo);
    if (bVar4) {
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      bVar4 = CallTargetIsArray(pPVar8->pnodeTarget);
      if (!bVar4) goto LAB_00810b6e;
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      spreadIndices._0_4_ = (uint)(pPVar8->spreadArgCount != 0) * 2 + 199;
    }
    else {
LAB_00810b6e:
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      spreadIndices._0_4_ = 0x160;
      if (pPVar8->spreadArgCount == 0) {
        spreadIndices._0_4_ = 0xc4;
      }
    }
    pBVar1 = &byteCodeGenerator->m_writer;
    bVar4 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(pBVar1,(OpCode)(int)spreadIndices);
    uVar2 = byteCodeGenerator->m_callSiteId;
    pBVar13 = (ByteCodeGenerator *)(ulong)uVar2;
    pBVar12 = pBVar13;
    if (bVar4) {
      if (uVar2 == 0xffff) {
        pBVar13 = (ByteCodeGenerator *)0xffff;
        pBVar12 = (ByteCodeGenerator *)CONCAT62((int6)((ulong)byteCodeGenerator >> 0x10),0xffff);
      }
      else {
        byteCodeGenerator->m_callSiteId = (uint16)(uVar2 + 1);
        pBVar12 = (ByteCodeGenerator *)(ulong)(uVar2 + 1);
      }
    }
    pAStack_60 = (AuxArray<unsigned_int> *)0x0;
    local_38 = byteCodeGenerator;
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    bVar4 = true;
    if ((pPVar8->field_0x24 & 0x10) == 0) {
      local_40 = (FuncInfo *)funcInfo->byteCodeFunction;
      lVar10._0_4_ = local_40->isInstInlineCacheCount;
      lVar10._4_4_ = local_40->referencedPropertyIdCount;
      spreadIndices._4_4_ = (uint)pBVar12;
      if (lVar10 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_00810f19;
        *puVar9 = 0;
        lVar10._0_4_ = local_40->isInstInlineCacheCount;
        lVar10._4_4_ = local_40->referencedPropertyIdCount;
        pBVar12 = (ByteCodeGenerator *)(ulong)spreadIndices._4_4_;
      }
      if (*(FuncInfo **)(lVar10 + 8) != local_40) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                           "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar4) goto LAB_00810f19;
        *puVar9 = 0;
        lVar10._0_4_ = local_40->isInstInlineCacheCount;
        lVar10._4_4_ = local_40->referencedPropertyIdCount;
        pBVar12 = (ByteCodeGenerator *)(ulong)spreadIndices._4_4_;
      }
      if ((*(ushort *)(lVar10 + 0x19) & 0x140) == 0) {
        bVar4 = false;
      }
      else {
        pPVar8 = ParseNode::AsParseNodeCall(pnode);
        bVar4 = pPVar8->pnodeArgs != (ParseNodePtr)0x0;
      }
    }
    callSiteId = (ProfileId)pBVar13;
    local_40 = funcInfo;
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    pnode_00 = pPVar8->pnodeArgs;
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    funcInfo = local_40;
    AVar5 = EmitArgList(pnode_00,0xffffffff,0xffffffff,0,1,local_38,local_40,callSiteId,
                        (ArgSlot)local_50,bVar4,callSiteId != (ProfileId)pBVar12,
                        pPVar8->spreadArgCount,&stack0xffffffffffffffa0);
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    FuncInfo::ReleaseLoc(funcInfo,pPVar8->pnodeTarget);
    pPVar8 = ParseNode::AsParseNodeCall(pnode);
    if (pPVar8->spreadArgCount == 0) {
      RVar7 = FuncInfo::AcquireLoc(funcInfo,pnode);
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      Js::ByteCodeWriter::CallI
                (pBVar1,(OpCode)(int)spreadIndices,RVar7,pPVar8->pnodeTarget->location,AVar5,
                 callSiteId,CallFlags_None);
    }
    else {
      if (pAStack_60 == (AuxArray<unsigned_int> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x2114,"(spreadIndices != nullptr)","spreadIndices != nullptr");
        if (!bVar4) goto LAB_00810f19;
        *puVar9 = 0;
      }
      funcInfo = local_40;
      if ((0x3fffffff < pAStack_60->count) ||
         (byteCount = pAStack_60->count * 4 + 4, local_38 = pBVar13, byteCount == 0)) {
        Math::DefaultOverflowPolicy();
      }
      RVar7 = FuncInfo::AcquireLoc(local_40,pnode);
      pPVar8 = ParseNode::AsParseNodeCall(pnode);
      Js::ByteCodeWriter::CallIExtended
                (pBVar1,(OpCode)(int)spreadIndices,RVar7,pPVar8->pnodeTarget->location,AVar5,
                 CallIExtended_SpreadArgs,pAStack_60,byteCount,(ProfileId)local_38,CallFlags_None);
    }
  }
  if ((ArgSlot)local_44 != AVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2122,"(argCount == actualArgCount)","argCount == actualArgCount");
    if (!bVar4) {
LAB_00810f19:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
LAB_00810efe:
  FuncInfo::EndRecordingOutArgs(funcInfo,(ArgSlot)local_50);
  return;
}

Assistant:

void EmitNew(ParseNode* pnode, ByteCodeGenerator* byteCodeGenerator, FuncInfo* funcInfo)
{
    Js::ArgSlot argCount = pnode->AsParseNodeCall()->argCount;
    argCount++; // include "this"

    BOOL fSideEffectArgs = FALSE;
    unsigned int tmpCount = CountArguments(pnode->AsParseNodeCall()->pnodeArgs, &fSideEffectArgs);
    AssertOrFailFastMsg(argCount == tmpCount, "argCount cannot overflow as max args capped at parser level");

    byteCodeGenerator->StartStatement(pnode);

    // Start call, allocate out param space
    funcInfo->StartRecordingOutArgs(argCount);

    // Assign the call target operand(s), putting them into expression temps if necessary to protect
    // them from side-effects.
    if (fSideEffectArgs)
    {
        SaveOpndValue(pnode->AsParseNodeCall()->pnodeTarget, funcInfo);
    }

    Emit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, funcInfo, false, true);

    if (pnode->AsParseNodeCall()->pnodeArgs == nullptr)
    {
        funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);
        Js::OpCode op = (CreateNativeArrays(byteCodeGenerator, funcInfo)
            && CallTargetIsArray(pnode->AsParseNodeCall()->pnodeTarget))
            ? Js::OpCode::NewScObjArray : Js::OpCode::NewScObject;
        Assert(argCount == 1);

        Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(op);
        byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argCount);
        byteCodeGenerator->Writer()->CallI(op, funcInfo->AcquireLoc(pnode),
            pnode->AsParseNodeCall()->pnodeTarget->location, argCount, callSiteId);
    }
    else
    {
        uint32 actualArgCount = 0;

        if (IsCallOfConstants(pnode))
        {
            byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argCount);
            funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);
            actualArgCount = EmitNewObjectOfConstants(pnode, byteCodeGenerator, funcInfo, argCount);
        }
        else
        {
            Js::OpCode op;
            if ((CreateNativeArrays(byteCodeGenerator, funcInfo) && CallTargetIsArray(pnode->AsParseNodeCall()->pnodeTarget)))
            {
                op = pnode->AsParseNodeCall()->spreadArgCount > 0 ? Js::OpCode::NewScObjArraySpread : Js::OpCode::NewScObjArray;
            }
            else
            {
                op = pnode->AsParseNodeCall()->spreadArgCount > 0 ? Js::OpCode::NewScObjectSpread : Js::OpCode::NewScObject;
            }

            Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(op);

            // Only emit profiled argouts if we're going to profile this call.
            bool emitProfiledArgouts = callSiteId != byteCodeGenerator->GetCurrentCallSiteId();

            Js::AuxArray<uint32> *spreadIndices = nullptr;

            // Emit argouts at end for generators so that we don't need to restore them when bailing in
            bool emitArgOutsAtEnd = pnode->AsParseNodeCall()->hasDestructuring || (funcInfo->byteCodeFunction->IsCoroutine() && pnode->AsParseNodeCall()->pnodeArgs != nullptr);
            actualArgCount = EmitArgList(pnode->AsParseNodeCall()->pnodeArgs, Js::Constants::NoRegister, Js::Constants::NoRegister,
                false, true, byteCodeGenerator, funcInfo, callSiteId, argCount, emitArgOutsAtEnd, emitProfiledArgouts, pnode->AsParseNodeCall()->spreadArgCount, &spreadIndices);

            funcInfo->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);

            if (pnode->AsParseNodeCall()->spreadArgCount > 0)
            {
                Assert(spreadIndices != nullptr);
                uint spreadExtraAlloc = UInt32Math::Mul(spreadIndices->count, sizeof(uint32));
                uint spreadIndicesSize = UInt32Math::Add(sizeof(*spreadIndices), spreadExtraAlloc);
                byteCodeGenerator->Writer()->CallIExtended(op, funcInfo->AcquireLoc(pnode), pnode->AsParseNodeCall()->pnodeTarget->location,
                    (uint16)actualArgCount, Js::CallIExtended_SpreadArgs,
                    spreadIndices, spreadIndicesSize, callSiteId);
            }
            else
            {
                byteCodeGenerator->Writer()->CallI(op, funcInfo->AcquireLoc(pnode), pnode->AsParseNodeCall()->pnodeTarget->location,
                    (uint16)actualArgCount, callSiteId);
            }
        }

        Assert(argCount == actualArgCount);
    }

    // End call, pop param space
    funcInfo->EndRecordingOutArgs(argCount);
    return;
}